

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_analysis.cpp
# Opt level: O2

SENode * __thiscall
spvtools::opt::ScalarEvolutionAnalysis::BuildGraphWithoutRecurrentTerm
          (ScalarEvolutionAnalysis *this,SENode *node,Loop *loop)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  SENode *pSVar3;
  pointer ppSVar4;
  pointer ppSVar5;
  _Head_base<0UL,_spvtools::opt::SENode_*,_false> local_60;
  SENode *local_58;
  SENode *itr;
  vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_> new_children;
  long lVar2;
  
  iVar1 = (*node->_vptr_SENode[6])(node);
  lVar2 = CONCAT44(extraout_var,iVar1);
  if (lVar2 == 0) {
    new_children.
    super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    new_children.
    super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    new_children.
    super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ppSVar4 = (node->children_).
              super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    for (ppSVar5 = (node->children_).
                   super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>
                   ._M_impl.super__Vector_impl_data._M_start; ppSVar5 != ppSVar4;
        ppSVar5 = ppSVar5 + 1) {
      itr = *ppSVar5;
      iVar1 = (*itr->_vptr_SENode[6])();
      lVar2 = CONCAT44(extraout_var_00,iVar1);
      if ((lVar2 == 0) || (*(Loop **)(lVar2 + 0x40) != loop)) {
        std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>::push_back
                  (&new_children,&itr);
      }
      else {
        local_58 = *(SENode **)(lVar2 + 0x38);
        std::vector<spvtools::opt::SENode*,std::allocator<spvtools::opt::SENode*>>::
        emplace_back<spvtools::opt::SENode*>
                  ((vector<spvtools::opt::SENode*,std::allocator<spvtools::opt::SENode*>> *)
                   &new_children,&local_58);
      }
    }
    pSVar3 = (SENode *)::operator_new(0x30);
    ppSVar5 = new_children.
              super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    (pSVar3->children_).
    super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pSVar3->children_).
    super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pSVar3->children_).
    super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pSVar3->parent_analysis_ = this;
    SENode::NumberOfNodes = SENode::NumberOfNodes + 1;
    pSVar3->unique_id_ = SENode::NumberOfNodes;
    pSVar3->_vptr_SENode = (_func_int **)&PTR_GetType_00a71208;
    for (ppSVar4 = new_children.
                   super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>
                   ._M_impl.super__Vector_impl_data._M_start; ppSVar4 != ppSVar5;
        ppSVar4 = ppSVar4 + 1) {
      (*pSVar3->_vptr_SENode[3])(pSVar3,*ppSVar4);
    }
    local_60._M_head_impl = pSVar3;
    pSVar3 = GetCachedOrAdd(this,(unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>
                                  *)&local_60);
    node = SimplifyExpression(this,pSVar3);
    if (local_60._M_head_impl != (SENode *)0x0) {
      (*(local_60._M_head_impl)->_vptr_SENode[2])();
    }
    local_60._M_head_impl = (SENode *)0x0;
    std::_Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>::
    ~_Vector_base(&new_children.
                   super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>
                 );
  }
  else if (*(Loop **)(lVar2 + 0x40) == loop) {
    node = *(SENode **)(lVar2 + 0x38);
  }
  return node;
}

Assistant:

SENode* ScalarEvolutionAnalysis::BuildGraphWithoutRecurrentTerm(
    SENode* node, const Loop* loop) {
  // If the node is already a recurrent expression belonging to loop then just
  // return the offset.
  SERecurrentNode* recurrent = node->AsSERecurrentNode();
  if (recurrent) {
    if (recurrent->GetLoop() == loop) {
      return recurrent->GetOffset();
    } else {
      return node;
    }
  }

  std::vector<SENode*> new_children;
  // Otherwise find the recurrent node in the children of this node.
  for (auto itr : *node) {
    recurrent = itr->AsSERecurrentNode();
    if (recurrent && recurrent->GetLoop() == loop) {
      new_children.push_back(recurrent->GetOffset());
    } else {
      new_children.push_back(itr);
    }
  }

  std::unique_ptr<SENode> add_node{new SEAddNode(this)};
  for (SENode* child : new_children) {
    add_node->AddChild(child);
  }

  return SimplifyExpression(GetCachedOrAdd(std::move(add_node)));
}